

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.cpp
# Opt level: O3

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_7(void)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_d4;
  Result local_d0;
  bool *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/type_traits/unsigned_integer_of_size.cpp"
             ,0x30,"std::is_same<burst::unsigned_integer_of_size_t<1>, std::uint8_t>::value","",
             (String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_CHECK);
  local_b0 = &std::integral_constant<bool,_true>::value;
  local_a8 = local_d4.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/type_traits/unsigned_integer_of_size.cpp"
             ,0x31,"std::is_same<burst::unsigned_integer_of_size_t<2>, std::uint16_t>::value","",
             (String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_CHECK);
  local_b0 = &std::integral_constant<bool,_true>::value;
  local_a8 = local_d4.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x_00);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/type_traits/unsigned_integer_of_size.cpp"
             ,0x32,"std::is_same<burst::unsigned_integer_of_size_t<4>, std::uint32_t>::value","",
             (String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_CHECK);
  local_b0 = &std::integral_constant<bool,_true>::value;
  local_a8 = local_d4.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x_01);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/type_traits/unsigned_integer_of_size.cpp"
             ,0x33,"std::is_same<burst::unsigned_integer_of_size_t<8>, std::uint64_t>::value","",
             (String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_CHECK);
  local_b0 = &std::integral_constant<bool,_true>::value;
  local_a8 = local_d4.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x_02);
  if (extraout_AL_02 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/type_traits/unsigned_integer_of_size.cpp"
             ,0x35,"std::is_same<burst::unsigned_integer_of_size_t<16>, boost::uint128_type>::value"
             ,"",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_CHECK);
  local_b0 = &std::integral_constant<bool,_true>::value;
  local_a8 = local_d4.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x_03);
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  return;
}

Assistant:

dummy ()
        {
            ++instances_count;
        }